

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

void mcu8str_dealloc(mcu8str *str)

{
  undefined8 *in_RDI;
  char *buf_to_free;
  void *local_18;
  
  if (*(int *)(in_RDI + 2) == 0) {
    local_18 = (void *)0x0;
  }
  else {
    local_18 = (void *)*in_RDI;
  }
  *in_RDI = mcu8str_dealloc::dummy;
  *(undefined4 *)(in_RDI + 1) = 0;
  *(undefined4 *)((long)in_RDI + 0xc) = 0;
  *(undefined4 *)(in_RDI + 2) = 0;
  if (local_18 != (void *)0x0) {
    free(local_18);
  }
  return;
}

Assistant:

void mcu8str_dealloc( mcu8str* str )
  {
    char * buf_to_free = ( str->owns_memory
                           ? str->c_str
                           : NULL );
    static char dummy[4] = { 0, 0, 0, 0 };
    str->c_str = &dummy[0];
    str->size = 0;
    str->buflen = 0;
    str->owns_memory = 0;
    if ( buf_to_free )
      STDNS free( buf_to_free );
  }